

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintBuffer.cpp
# Opt level: O1

void __thiscall yb::PrintBuffer::PrintBuffer(PrintBuffer *this,size_t size)

{
  (this->buffer_)._M_dataplus._M_p = (pointer)&(this->buffer_).field_2;
  (this->buffer_)._M_string_length = 0;
  (this->buffer_).field_2._M_local_buf[0] = '\0';
  (this->position_)._M_current = (char *)0x0;
  std::__cxx11::string::reserve((ulong)this);
  (this->position_)._M_current = (this->buffer_)._M_dataplus._M_p + (this->buffer_)._M_string_length
  ;
  return;
}

Assistant:

PrintBuffer::PrintBuffer(size_t size) {
    buffer_.reserve(size);
    position_ = buffer_.end();
}